

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

void duckdb::MakeDateFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  BaseScalarFunction *pBVar1;
  long in_RDI;
  ScalarFunction *func;
  BaseScalarFunction *function;
  long lVar2;
  LogicalType *this_00;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  child_list_t<LogicalType> make_date_children;
  allocator_type local_689;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  code *local_670;
  code *local_668;
  undefined8 local_660;
  code *local_658;
  code *local_650;
  code *local_648;
  undefined8 local_640;
  code *local_638;
  code *local_630;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_628;
  LogicalType local_610 [24];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_5f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5e0;
  LogicalType local_5c8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5b0;
  LogicalType local_598 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_580;
  LogicalType local_568 [24];
  LogicalType local_550 [24];
  LogicalType local_538 [24];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 local_500 [48];
  LogicalType local_4d0 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_4c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_490;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"make_date","");
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_520[0] != local_510) {
    operator_delete(local_520[0]);
  }
  duckdb::LogicalType::LogicalType((LogicalType *)local_500,INTEGER);
  __l._M_len = 1;
  __l._M_array = (iterator)local_500;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_580,__l,(allocator_type *)&local_628);
  duckdb::LogicalType::LogicalType(local_598,DATE);
  local_640 = 0;
  local_648 = MakeDateFromEpoch;
  local_630 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_638 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_538,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_580,local_598,&local_648,0,0,0,0,local_538,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_538);
  if (local_638 != (code *)0x0) {
    (*local_638)(&local_648,&local_648,3);
  }
  duckdb::LogicalType::~LogicalType(local_598);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_580);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_500);
  duckdb::LogicalType::LogicalType((LogicalType *)local_500,BIGINT);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_500 + 0x18),BIGINT);
  duckdb::LogicalType::LogicalType(local_4d0,BIGINT);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_500;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_5b0,__l_00,(allocator_type *)&local_628);
  duckdb::LogicalType::LogicalType(local_5c8,DATE);
  local_660 = 0;
  local_668 = ExecuteMakeDate<long>;
  local_650 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_658 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_550,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_5b0,local_5c8,&local_668,0,0,0,0,local_550,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_550);
  if (local_658 != (code *)0x0) {
    (*local_658)(&local_668,&local_668,3);
  }
  duckdb::LogicalType::~LogicalType(local_5c8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5b0);
  lVar2 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_500 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_500,(char (*) [5])0x7739ab,(LogicalTypeId *)&LogicalType::BIGINT);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[6],_const_duckdb::LogicalTypeId_&,_true>
            (&local_4c8,(char (*) [6])0x771356,(LogicalTypeId *)&LogicalType::BIGINT);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
            (&local_490,(char (*) [4])0x7703a4,(LogicalTypeId *)&LogicalType::BIGINT);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_500;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector(&local_628,__l_01,&local_689);
  lVar2 = -0xa8;
  this_00 = &local_490.second;
  do {
    duckdb::LogicalType::~LogicalType(this_00);
    if (this_00 + -0x10 != *(LogicalType **)(this_00 + -0x20)) {
      operator_delete(*(LogicalType **)(this_00 + -0x20));
    }
    this_00 = this_00 + -0x38;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector(&local_5f8,&local_628);
  duckdb::LogicalType::STRUCT(local_500,&local_5f8);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_500;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_5e0,__l_02,(allocator_type *)&local_689);
  duckdb::LogicalType::LogicalType(local_610,DATE);
  local_680 = 0;
  local_688 = ExecuteStructMakeDate<long>;
  local_670 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_678 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_568,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_458,&local_5e0,local_610,&local_688,0,0,0,0,local_568,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_458);
  local_458._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_458 + 0xb0U),(_Any_data *)((long)&local_458 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_568);
  if (local_678 != (code *)0x0) {
    (*local_678)(&local_688,&local_688,3);
  }
  duckdb::LogicalType::~LogicalType(local_610);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5e0);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_500);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_5f8);
  function = *(BaseScalarFunction **)(in_RDI + 0x20);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_628);
  return;
}

Assistant:

ScalarFunctionSet MakeDateFun::GetFunctions() {
	ScalarFunctionSet make_date("make_date");
	make_date.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::DATE, MakeDateFromEpoch));
	make_date.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT},
	                                     LogicalType::DATE, ExecuteMakeDate<int64_t>));

	child_list_t<LogicalType> make_date_children {
	    {"year", LogicalType::BIGINT}, {"month", LogicalType::BIGINT}, {"day", LogicalType::BIGINT}};
	make_date.AddFunction(
	    ScalarFunction({LogicalType::STRUCT(make_date_children)}, LogicalType::DATE, ExecuteStructMakeDate<int64_t>));
	for (auto &func : make_date.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return make_date;
}